

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShow.c
# Opt level: O0

void Gia_WriteDotAig(Gia_Man_t *p,char *pFileName,Vec_Int_t *vBold,Vec_Int_t *vAdds,Vec_Int_t *vXors
                    ,Vec_Int_t *vMapAdds,Vec_Int_t *vMapXors,Vec_Int_t *vOrder)

{
  Vec_Int_t *p_00;
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  FILE *__stream;
  char *pcVar8;
  bool bVar9;
  bool bVar10;
  int iXor2;
  int iXor;
  int k_1;
  int fXor2;
  int iBox2;
  int iBox_1;
  int k;
  int iNode_2;
  int iNode_1;
  int iBox;
  int iNode;
  int nFadds;
  int fConstIsUsed;
  int i;
  int Level;
  int Prev;
  int LevelMax;
  Gia_Obj_t *pNode;
  FILE *pFile;
  Vec_Int_t *vMapAdds_local;
  Vec_Int_t *vXors_local;
  Vec_Int_t *vAdds_local;
  Vec_Int_t *vBold_local;
  char *pFileName_local;
  Gia_Man_t *p_local;
  
  bVar10 = false;
  uVar1 = Ree_ManCountFadds(vAdds);
  iVar2 = Gia_ManAndNum(p);
  if (iVar2 < 0x7d1) {
    __stream = fopen(pFileName,"w");
    if (__stream == (FILE *)0x0) {
      fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",pFileName);
    }
    else {
      if (vBold != (Vec_Int_t *)0x0) {
        nFadds = 0;
        while( true ) {
          iVar2 = Vec_IntSize(vBold);
          bVar9 = false;
          if (nFadds < iVar2) {
            iVar2 = Vec_IntEntry(vBold,nFadds);
            _Prev = Gia_ManObj(p,iVar2);
            bVar9 = _Prev != (Gia_Obj_t *)0x0;
          }
          if (!bVar9) break;
          *(ulong *)_Prev = *(ulong *)_Prev & 0xffffffffbfffffff | 0x40000000;
          nFadds = nFadds + 1;
        }
      }
      uVar5 = p->nLevels;
      uVar3 = uVar5 + 1;
      nFadds = 0;
      while( true ) {
        iVar2 = Vec_IntSize(p->vCos);
        bVar9 = false;
        if (nFadds < iVar2) {
          _Prev = Gia_ManCo(p,nFadds);
          bVar9 = _Prev != (Gia_Obj_t *)0x0;
        }
        if (!bVar9) break;
        p_00 = p->vLevels;
        iVar2 = Gia_ObjId(p,_Prev);
        Vec_IntWriteEntry(p_00,iVar2,uVar3);
        nFadds = nFadds + 1;
      }
      fprintf(__stream,"# %s\n","AIG structure generated by GIA package");
      fprintf(__stream,"\n");
      fprintf(__stream,"digraph AIG {\n");
      fprintf(__stream,"size = \"7.5,10\";\n");
      fprintf(__stream,"center = true;\n");
      fprintf(__stream,"edge [dir = back];\n");
      fprintf(__stream,"\n");
      fprintf(__stream,"{\n");
      fprintf(__stream,"  node [shape = plaintext];\n");
      fprintf(__stream,"  edge [style = invis];\n");
      fprintf(__stream,"  LevelTitle1 [label=\"\"];\n");
      fprintf(__stream,"  LevelTitle2 [label=\"\"];\n");
      for (fConstIsUsed = uVar3; -1 < fConstIsUsed; fConstIsUsed = fConstIsUsed + -1) {
        fprintf(__stream,"  Level%d",(ulong)(uint)fConstIsUsed);
        fprintf(__stream," [label = ");
        fprintf(__stream,"\"");
        fprintf(__stream,"\"");
        fprintf(__stream,"];\n");
      }
      fprintf(__stream,"  LevelTitle1 ->  LevelTitle2 ->");
      for (fConstIsUsed = uVar3; -1 < fConstIsUsed; fConstIsUsed = fConstIsUsed + -1) {
        fprintf(__stream,"  Level%d",(ulong)(uint)fConstIsUsed);
        if (fConstIsUsed == 0) {
          fprintf(__stream,";");
        }
        else {
          fprintf(__stream," ->");
        }
      }
      fprintf(__stream,"\n");
      fprintf(__stream,"}");
      fprintf(__stream,"\n");
      fprintf(__stream,"\n");
      fprintf(__stream,"{\n");
      fprintf(__stream,"  rank = same;\n");
      fprintf(__stream,"  LevelTitle1;\n");
      fprintf(__stream,"  title1 [shape=plaintext,\n");
      fprintf(__stream,"          fontsize=20,\n");
      fprintf(__stream,"          fontname = \"Times-Roman\",\n");
      fprintf(__stream,"          label=\"");
      fprintf(__stream,"%s","AIG structure visualized by ABC");
      fprintf(__stream,"\\n");
      fprintf(__stream,"Benchmark \\\"%s\\\". ","aig");
      fprintf(__stream,"\"\n");
      fprintf(__stream,"         ];\n");
      fprintf(__stream,"}");
      fprintf(__stream,"\n");
      fprintf(__stream,"\n");
      fprintf(__stream,"{\n");
      fprintf(__stream,"  rank = same;\n");
      fprintf(__stream,"  LevelTitle2;\n");
      fprintf(__stream,"  title2 [shape=plaintext,\n");
      fprintf(__stream,"          fontsize=18,\n");
      fprintf(__stream,"          fontname = \"Times-Roman\",\n");
      fprintf(__stream,"          label=\"");
      uVar4 = Gia_ManAndNum(p);
      iVar2 = Vec_IntSize(vAdds);
      fprintf(__stream,
              "The AIG contains %d nodes, %d full-adders, and %d half-adders, and spans %d levels.",
              (ulong)uVar4,(ulong)uVar1,(ulong)(iVar2 / 6 - uVar1),(ulong)uVar5);
      fprintf(__stream,"\\n");
      fprintf(__stream,"\"\n");
      fprintf(__stream,"         ];\n");
      fprintf(__stream,"}");
      fprintf(__stream,"\n");
      fprintf(__stream,"\n");
      fprintf(__stream,"{\n");
      fprintf(__stream,"  rank = same;\n");
      fprintf(__stream,"  Level%d;\n",(ulong)uVar3);
      nFadds = 0;
      while( true ) {
        iVar2 = Vec_IntSize(p->vCos);
        bVar9 = false;
        if (nFadds < iVar2) {
          _Prev = Gia_ManCo(p,nFadds);
          bVar9 = _Prev != (Gia_Obj_t *)0x0;
        }
        if (!bVar9) break;
        iVar2 = Gia_ObjFaninId0p(p,_Prev);
        if (iVar2 == 0) {
          bVar10 = true;
        }
        uVar1 = Gia_ObjId(p,_Prev);
        uVar3 = Gia_ObjId(p,_Prev);
        fprintf(__stream,"  Node%d [label = \"%d\"",(ulong)uVar1,(ulong)uVar3);
        fprintf(__stream,", shape = %s","invtriangle");
        fprintf(__stream,", color = coral, fillcolor = coral");
        fprintf(__stream,"];\n");
        nFadds = nFadds + 1;
      }
      fprintf(__stream,"}");
      fprintf(__stream,"\n");
      fprintf(__stream,"\n");
      for (fConstIsUsed = uVar5; 0 < fConstIsUsed; fConstIsUsed = fConstIsUsed + -1) {
        fprintf(__stream,"{\n");
        fprintf(__stream,"  rank = same;\n");
        fprintf(__stream,"  Level%d;\n",(ulong)(uint)fConstIsUsed);
        nFadds = 0;
        while( true ) {
          iVar2 = Vec_IntSize(vOrder);
          bVar9 = false;
          if (nFadds < iVar2) {
            iVar2 = Vec_IntEntry(vOrder,nFadds);
            _Prev = Gia_ManObj(p,iVar2);
            bVar9 = _Prev != (Gia_Obj_t *)0x0;
          }
          if (!bVar9) break;
          uVar1 = Gia_ObjId(p,_Prev);
          iVar2 = Gia_ObjLevel(p,_Prev);
          if (iVar2 == fConstIsUsed) {
            if (((*(ulong *)_Prev >> 0x1e & 1) == 0) &&
               (iVar2 = Vec_IntEntry(vMapAdds,uVar1), -1 < iVar2)) {
              iVar2 = Vec_IntEntry(vMapAdds,uVar1);
              uVar1 = Gia_ShowAddOut(vAdds,vMapAdds,uVar1);
              uVar5 = Vec_IntEntry(vAdds,iVar2 * 6 + 3);
              uVar3 = Vec_IntEntry(vAdds,iVar2 * 6 + 4);
              fprintf(__stream,"  Node%d [label = \"%d_%d\"",(ulong)uVar1,(ulong)uVar5,(ulong)uVar3)
              ;
              iVar2 = Vec_IntEntry(vAdds,iVar2 * 6 + 2);
              if (iVar2 == 0) {
                fprintf(__stream,", shape = octagon");
              }
              else {
                fprintf(__stream,", shape = doubleoctagon");
              }
            }
            else {
              iVar2 = Vec_IntEntry(vMapXors,uVar1);
              if (iVar2 < 0) {
                iVar2 = Gia_ObjIsXor(_Prev);
                if (iVar2 == 0) {
                  iVar2 = Gia_ObjIsMux(p,_Prev);
                  if (iVar2 == 0) {
                    fprintf(__stream,"  Node%d [label = \"%d\"",(ulong)uVar1,(ulong)uVar1);
                    fprintf(__stream,", shape = ellipse");
                  }
                  else {
                    fprintf(__stream,"  Node%d [label = \"%d\"",(ulong)uVar1,(ulong)uVar1);
                    fprintf(__stream,", shape = trapezium");
                  }
                }
                else {
                  fprintf(__stream,"  Node%d [label = \"%d\"",(ulong)uVar1,(ulong)uVar1);
                  fprintf(__stream,", shape = doublecircle");
                }
              }
              else {
                fprintf(__stream,"  Node%d [label = \"%d\"",(ulong)uVar1,(ulong)uVar1);
                fprintf(__stream,", shape = doublecircle");
              }
            }
            if ((*(ulong *)_Prev >> 0x1e & 1) != 0) {
              fprintf(__stream,", style = filled");
            }
            fprintf(__stream,"];\n");
          }
          nFadds = nFadds + 1;
        }
        fprintf(__stream,"}");
        fprintf(__stream,"\n");
        fprintf(__stream,"\n");
      }
      fprintf(__stream,"{\n");
      fprintf(__stream,"  rank = same;\n");
      fprintf(__stream,"  Level%d;\n",0);
      if (bVar10) {
        fprintf(__stream,"  Node%d [label = \"Const0\"",0);
        fprintf(__stream,", shape = ellipse");
        fprintf(__stream,", color = coral, fillcolor = coral");
        fprintf(__stream,"];\n");
      }
      nFadds = 0;
      while( true ) {
        iVar2 = Vec_IntSize(p->vCis);
        bVar10 = false;
        if (nFadds < iVar2) {
          _Prev = Gia_ManCi(p,nFadds);
          bVar10 = _Prev != (Gia_Obj_t *)0x0;
        }
        if (!bVar10) break;
        uVar1 = Gia_ObjId(p,_Prev);
        uVar5 = Gia_ObjId(p,_Prev);
        fprintf(__stream,"  Node%d [label = \"%d\"",(ulong)uVar1,(ulong)uVar5);
        fprintf(__stream,", shape = %s","triangle");
        fprintf(__stream,", color = coral, fillcolor = coral");
        fprintf(__stream,"];\n");
        nFadds = nFadds + 1;
      }
      fprintf(__stream,"}");
      fprintf(__stream,"\n");
      fprintf(__stream,"\n");
      fprintf(__stream,"title1 -> title2 [style = invis];\n");
      nFadds = 0;
      while( true ) {
        iVar2 = Vec_IntSize(p->vCos);
        bVar10 = false;
        if (nFadds < iVar2) {
          _Prev = Gia_ManCo(p,nFadds);
          bVar10 = _Prev != (Gia_Obj_t *)0x0;
        }
        if (!bVar10) break;
        uVar1 = Gia_ObjId(p,_Prev);
        fprintf(__stream,"title2 -> Node%d [style = invis];\n",(ulong)uVar1);
        nFadds = nFadds + 1;
      }
      i = -1;
      nFadds = 0;
      while( true ) {
        iVar2 = Vec_IntSize(p->vCos);
        bVar10 = false;
        if (nFadds < iVar2) {
          _Prev = Gia_ManCo(p,nFadds);
          bVar10 = _Prev != (Gia_Obj_t *)0x0;
        }
        if (!bVar10) break;
        if (0 < nFadds) {
          uVar1 = Gia_ObjId(p,_Prev);
          fprintf(__stream,"Node%d -> Node%d [style = invis];\n",(ulong)(uint)i,(ulong)uVar1);
        }
        i = Gia_ObjId(p,_Prev);
        nFadds = nFadds + 1;
      }
      i = -1;
      nFadds = 0;
      while( true ) {
        iVar2 = Vec_IntSize(p->vCis);
        bVar10 = false;
        if (nFadds < iVar2) {
          _Prev = Gia_ManCi(p,nFadds);
          bVar10 = _Prev != (Gia_Obj_t *)0x0;
        }
        if (!bVar10) break;
        if (0 < nFadds) {
          uVar1 = Gia_ObjId(p,_Prev);
          fprintf(__stream,"Node%d -> Node%d [style = invis];\n",(ulong)(uint)i,(ulong)uVar1);
        }
        i = Gia_ObjId(p,_Prev);
        nFadds = nFadds + 1;
      }
      nFadds = 0;
      while( true ) {
        iVar2 = Vec_IntSize(p->vCos);
        bVar10 = false;
        if (nFadds < iVar2) {
          _Prev = Gia_ManCo(p,nFadds);
          bVar10 = _Prev != (Gia_Obj_t *)0x0;
        }
        if (!bVar10) break;
        uVar1 = Gia_ObjId(p,_Prev);
        fprintf(__stream,"Node%d",(ulong)uVar1);
        fprintf(__stream," -> ");
        iVar2 = Gia_ObjFaninId0(_Prev,uVar1);
        uVar1 = Gia_ShowAddOut(vAdds,vMapAdds,iVar2);
        fprintf(__stream,"Node%d",(ulong)uVar1);
        fprintf(__stream," [");
        iVar2 = Gia_ObjFaninC0(_Prev);
        pcVar8 = "solid";
        if (iVar2 != 0) {
          pcVar8 = "dotted";
        }
        fprintf(__stream,"style = %s",pcVar8);
        fprintf(__stream,"]");
        fprintf(__stream,";\n");
        nFadds = nFadds + 1;
      }
      nFadds = 0;
      while( true ) {
        iVar2 = Vec_IntSize(vOrder);
        bVar10 = false;
        if (nFadds < iVar2) {
          iVar2 = Vec_IntEntry(vOrder,nFadds);
          _Prev = Gia_ManObj(p,iVar2);
          bVar10 = _Prev != (Gia_Obj_t *)0x0;
        }
        if (!bVar10) break;
        uVar1 = Gia_ObjId(p,_Prev);
        iVar2 = Gia_ObjId(p,_Prev);
        iVar2 = Vec_IntEntry(vMapAdds,iVar2);
        if (iVar2 < 0) {
          iVar2 = Gia_ObjId(p,_Prev);
          iVar2 = Vec_IntEntry(vMapXors,iVar2);
          if (iVar2 < 0) {
            fprintf(__stream,"Node%d",(ulong)uVar1);
            fprintf(__stream," -> ");
            iVar2 = Gia_ObjFaninId0(_Prev,uVar1);
            uVar5 = Gia_ShowAddOut(vAdds,vMapAdds,iVar2);
            fprintf(__stream,"Node%d",(ulong)uVar5);
            fprintf(__stream," [");
            iVar2 = Gia_ObjFaninC0(_Prev);
            pcVar8 = "solid";
            if (iVar2 != 0) {
              pcVar8 = "dotted";
            }
            fprintf(__stream,"style = %s",pcVar8);
            fprintf(__stream,"]");
            fprintf(__stream,";\n");
            iVar2 = Gia_ObjIsAnd(_Prev);
            if (iVar2 != 0) {
              fprintf(__stream,"Node%d",(ulong)uVar1);
              fprintf(__stream," -> ");
              iVar2 = Gia_ObjFaninId1(_Prev,uVar1);
              uVar5 = Gia_ShowAddOut(vAdds,vMapAdds,iVar2);
              fprintf(__stream,"Node%d",(ulong)uVar5);
              fprintf(__stream," [");
              iVar2 = Gia_ObjFaninC1(_Prev);
              pcVar8 = "solid";
              if (iVar2 != 0) {
                pcVar8 = "dotted";
              }
              fprintf(__stream,"style = %s",pcVar8);
              fprintf(__stream,"]");
              fprintf(__stream,";\n");
              iVar2 = Gia_ObjIsMux(p,_Prev);
              if (iVar2 != 0) {
                fprintf(__stream,"Node%d",(ulong)uVar1);
                fprintf(__stream," -> ");
                iVar2 = Gia_ObjFaninId2(p,uVar1);
                uVar1 = Gia_ShowAddOut(vAdds,vMapAdds,iVar2);
                fprintf(__stream,"Node%d",(ulong)uVar1);
                fprintf(__stream," [");
                iVar2 = Gia_ObjFaninC2(p,_Prev);
                pcVar8 = "solid";
                if (iVar2 != 0) {
                  pcVar8 = "dotted";
                }
                fprintf(__stream,"style = %s",pcVar8);
                fprintf(__stream,"]");
                fprintf(__stream,";\n");
              }
            }
          }
          else {
            iVar2 = Vec_IntEntry(vMapXors,uVar1);
            for (iXor2 = 1; iXor2 < 4; iXor2 = iXor2 + 1) {
              iVar6 = Vec_IntEntry(vXors,iVar2 * 4 + iXor2);
              if (iVar6 != 0) {
                iVar6 = Vec_IntEntry(vXors,iVar2 * 4 + iXor2);
                iVar6 = Vec_IntEntry(vMapXors,iVar6);
                fprintf(__stream,"Node%d",(ulong)uVar1);
                fprintf(__stream," -> ");
                iVar7 = Vec_IntEntry(vXors,iVar2 * 4 + iXor2);
                uVar5 = Gia_ShowAddOut(vAdds,vMapAdds,iVar7);
                fprintf(__stream,"Node%d",(ulong)uVar5);
                fprintf(__stream," [");
                pcVar8 = "solid";
                if (-1 < iVar6) {
                  pcVar8 = "bold";
                }
                fprintf(__stream,"style = %s",pcVar8);
                fprintf(__stream,"]");
                fprintf(__stream,";\n");
              }
            }
          }
        }
        else {
          iVar2 = Vec_IntEntry(vMapAdds,uVar1);
          for (iBox2 = 0; iBox2 < 3; iBox2 = iBox2 + 1) {
            iVar6 = Vec_IntEntry(vAdds,iVar2 * 6 + iBox2);
            if (iVar6 != 0) {
              iVar6 = Vec_IntEntry(vAdds,iVar2 * 6 + iBox2);
              iVar6 = Vec_IntEntry(vMapAdds,iVar6);
              if (iVar6 < 0) {
                bVar10 = false;
              }
              else {
                iVar6 = Vec_IntEntry(vAdds,iVar6 * 6 + 3);
                iVar7 = Vec_IntEntry(vAdds,iVar2 * 6 + iBox2);
                bVar10 = iVar6 == iVar7;
              }
              uVar5 = Gia_ShowAddOut(vAdds,vMapAdds,uVar1);
              fprintf(__stream,"Node%d",(ulong)uVar5);
              fprintf(__stream," -> ");
              iVar6 = Vec_IntEntry(vAdds,iVar2 * 6 + iBox2);
              uVar5 = Gia_ShowAddOut(vAdds,vMapAdds,iVar6);
              fprintf(__stream,"Node%d",(ulong)uVar5);
              fprintf(__stream," [");
              pcVar8 = "solid";
              if (bVar10) {
                pcVar8 = "bold";
              }
              fprintf(__stream,"style = %s",pcVar8);
              fprintf(__stream,"]");
              fprintf(__stream,";\n");
            }
          }
        }
        nFadds = nFadds + 1;
      }
      fprintf(__stream,"}");
      fprintf(__stream,"\n");
      fprintf(__stream,"\n");
      fclose(__stream);
      if (vBold != (Vec_Int_t *)0x0) {
        nFadds = 0;
        while( true ) {
          iVar2 = Vec_IntSize(vBold);
          bVar10 = false;
          if (nFadds < iVar2) {
            iVar2 = Vec_IntEntry(vBold,nFadds);
            _Prev = Gia_ManObj(p,iVar2);
            bVar10 = _Prev != (Gia_Obj_t *)0x0;
          }
          if (!bVar10) break;
          *(ulong *)_Prev = *(ulong *)_Prev & 0xffffffffbfffffff;
          nFadds = nFadds + 1;
        }
      }
      Vec_IntFreeP(&p->vLevels);
    }
  }
  else {
    fprintf(_stdout,"Cannot visualize AIG with more than %d nodes.\n",2000);
  }
  return;
}

Assistant:

void Gia_WriteDotAig( Gia_Man_t * p, char * pFileName, Vec_Int_t * vBold, Vec_Int_t * vAdds, Vec_Int_t * vXors, Vec_Int_t * vMapAdds, Vec_Int_t * vMapXors, Vec_Int_t * vOrder )
{
    FILE * pFile;
    Gia_Obj_t * pNode;//, * pTemp, * pPrev;
    int LevelMax, Prev, Level, i;
    int fConstIsUsed = 0;
    int nFadds = Ree_ManCountFadds( vAdds );

    if ( Gia_ManAndNum(p) > NODE_MAX )
    {
        fprintf( stdout, "Cannot visualize AIG with more than %d nodes.\n", NODE_MAX );
        return;
    }
    if ( (pFile = fopen( pFileName, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", pFileName );
        return;
    }

    // mark the nodes
    if ( vBold )
        Gia_ManForEachObjVec( vBold, p, pNode, i )
            pNode->fMark0 = 1;

    // compute levels
    LevelMax = 1 + p->nLevels;
    Gia_ManForEachCo( p, pNode, i )
        Vec_IntWriteEntry( p->vLevels, Gia_ObjId(p, pNode), LevelMax );

    // write the DOT header
    fprintf( pFile, "# %s\n",  "AIG structure generated by GIA package" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "digraph AIG {\n" );
    fprintf( pFile, "size = \"7.5,10\";\n" );
//  fprintf( pFile, "ranksep = 0.5;\n" );
//  fprintf( pFile, "nodesep = 0.5;\n" );
    fprintf( pFile, "center = true;\n" );
//  fprintf( pFile, "orientation = landscape;\n" );
//  fprintf( pFile, "edge [fontsize = 10];\n" );
//  fprintf( pFile, "edge [dir = none];\n" );
    fprintf( pFile, "edge [dir = back];\n" );
    fprintf( pFile, "\n" );

    // labels on the left of the picture
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  node [shape = plaintext];\n" );
    fprintf( pFile, "  edge [style = invis];\n" );
    fprintf( pFile, "  LevelTitle1 [label=\"\"];\n" );
    fprintf( pFile, "  LevelTitle2 [label=\"\"];\n" );
    // generate node names with labels
    for ( Level = LevelMax; Level >= 0; Level-- )
    {
        // the visible node name
        fprintf( pFile, "  Level%d", Level );
        fprintf( pFile, " [label = " );
        // label name
        fprintf( pFile, "\"" );
        fprintf( pFile, "\"" );
        fprintf( pFile, "];\n" );
    }

    // genetate the sequence of visible/invisible nodes to mark levels
    fprintf( pFile, "  LevelTitle1 ->  LevelTitle2 ->" );
    for ( Level = LevelMax; Level >= 0; Level-- )
    {
        // the visible node name
        fprintf( pFile, "  Level%d",  Level );
        // the connector
        if ( Level != 0 )
            fprintf( pFile, " ->" );
        else
            fprintf( pFile, ";" );
    }
    fprintf( pFile, "\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate title box on top
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    fprintf( pFile, "  LevelTitle1;\n" );
    fprintf( pFile, "  title1 [shape=plaintext,\n" );
    fprintf( pFile, "          fontsize=20,\n" );
    fprintf( pFile, "          fontname = \"Times-Roman\",\n" );
    fprintf( pFile, "          label=\"" );
    fprintf( pFile, "%s", "AIG structure visualized by ABC" );
    fprintf( pFile, "\\n" );
    fprintf( pFile, "Benchmark \\\"%s\\\". ", "aig" );
//    fprintf( pFile, "Time was %s. ",  Extra_TimeStamp() );
    fprintf( pFile, "\"\n" );
    fprintf( pFile, "         ];\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate statistics box
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    fprintf( pFile, "  LevelTitle2;\n" );
    fprintf( pFile, "  title2 [shape=plaintext,\n" );
    fprintf( pFile, "          fontsize=18,\n" );
    fprintf( pFile, "          fontname = \"Times-Roman\",\n" );
    fprintf( pFile, "          label=\"" );
    fprintf( pFile, "The AIG contains %d nodes, %d full-adders, and %d half-adders, and spans %d levels.", 
        Gia_ManAndNum(p), nFadds, Vec_IntSize(vAdds)/6-nFadds, LevelMax-1 );
    fprintf( pFile, "\\n" );
    fprintf( pFile, "\"\n" );
    fprintf( pFile, "         ];\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate the COs
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    // the labeling node of this level
    fprintf( pFile, "  Level%d;\n",  LevelMax );
    // generate the CO nodes
    Gia_ManForEachCo( p, pNode, i )
    {
        if ( Gia_ObjFaninId0p(p, pNode) == 0 )
            fConstIsUsed = 1;
        fprintf( pFile, "  Node%d [label = \"%d\"", Gia_ObjId(p, pNode), Gia_ObjId(p, pNode) ); 

        fprintf( pFile, ", shape = %s", "invtriangle" );
        fprintf( pFile, ", color = coral, fillcolor = coral" );
        fprintf( pFile, "];\n" );
    }
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate nodes of each rank
    for ( Level = LevelMax - 1; Level > 0; Level-- )
    {
        fprintf( pFile, "{\n" );
        fprintf( pFile, "  rank = same;\n" );
        // the labeling node of this level
        fprintf( pFile, "  Level%d;\n",  Level );
        Gia_ManForEachObjVec( vOrder, p, pNode, i )
        {
            int iNode = Gia_ObjId( p, pNode );
            if ( (int)Gia_ObjLevel(p, pNode) != Level )
                continue;
/*
            fprintf( pFile, "  Node%d [label = \"%d\"", Gia_ObjId(p, pNode), Gia_ObjId(p, pNode) ); 
            if ( Gia_ObjIsXor(pNode) )
                fprintf( pFile, ", shape = doublecircle" );
            else if ( Gia_ObjIsMux(p, pNode) )
                fprintf( pFile, ", shape = trapezium" );
            else
                fprintf( pFile, ", shape = ellipse" );
*/
            if ( !pNode->fMark0 && Vec_IntEntry(vMapAdds, iNode) >= 0 )
            {
                int iBox = Vec_IntEntry(vMapAdds, iNode);
                fprintf( pFile, "  Node%d [label = \"%d_%d\"", Gia_ShowAddOut(vAdds, vMapAdds, iNode), Vec_IntEntry(vAdds, 6*iBox+3), Vec_IntEntry(vAdds, 6*iBox+4) ); 
                if ( Vec_IntEntry(vAdds, 6*iBox+2) == 0 )
                    fprintf( pFile, ", shape = octagon" );
                else 
                    fprintf( pFile, ", shape = doubleoctagon" );
            }
            else if ( Vec_IntEntry(vMapXors, iNode) >= 0 )
            {
                fprintf( pFile, "  Node%d [label = \"%d\"", iNode, iNode ); 
                fprintf( pFile, ", shape = doublecircle" );
            }
            else if ( Gia_ObjIsXor(pNode) )
            {
                fprintf( pFile, "  Node%d [label = \"%d\"", iNode, iNode ); 
                fprintf( pFile, ", shape = doublecircle" );
            }
            else if ( Gia_ObjIsMux(p, pNode) )
            {
                fprintf( pFile, "  Node%d [label = \"%d\"", iNode, iNode ); 
                fprintf( pFile, ", shape = trapezium" );
            }
            else
            {
                fprintf( pFile, "  Node%d [label = \"%d\"", iNode, iNode ); 
                fprintf( pFile, ", shape = ellipse" );
            }
            if ( pNode->fMark0 )
                fprintf( pFile, ", style = filled" );
            fprintf( pFile, "];\n" );
        }
        fprintf( pFile, "}" );
        fprintf( pFile, "\n" );
        fprintf( pFile, "\n" );
    }

    // generate the CI nodes
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    // the labeling node of this level
    fprintf( pFile, "  Level%d;\n",  0 );
    // generate constant node
    if ( fConstIsUsed )
    {
        // check if the costant node is present
        fprintf( pFile, "  Node%d [label = \"Const0\"", 0 );
        fprintf( pFile, ", shape = ellipse" );
        fprintf( pFile, ", color = coral, fillcolor = coral" );
        fprintf( pFile, "];\n" );
    }
    // generate the CI nodes
    Gia_ManForEachCi( p, pNode, i )
    {
        fprintf( pFile, "  Node%d [label = \"%d\"", Gia_ObjId(p, pNode), Gia_ObjId(p, pNode) ); 

        fprintf( pFile, ", shape = %s", "triangle" );
        fprintf( pFile, ", color = coral, fillcolor = coral" );
        fprintf( pFile, "];\n" );
    }
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate invisible edges from the square down
    fprintf( pFile, "title1 -> title2 [style = invis];\n" );
    Gia_ManForEachCo( p, pNode, i )
        fprintf( pFile, "title2 -> Node%d [style = invis];\n", Gia_ObjId(p, pNode) );
    // generate invisible edges among the COs
    Prev = -1;
    Gia_ManForEachCo( p, pNode, i )
    {
        if ( i > 0 )
            fprintf( pFile, "Node%d -> Node%d [style = invis];\n", Prev, Gia_ObjId(p, pNode) );
        Prev = Gia_ObjId(p, pNode);
    }
    // generate invisible edges among the CIs
    Prev = -1;
    Gia_ManForEachCi( p, pNode, i )
    {
        if ( i > 0 )
            fprintf( pFile, "Node%d -> Node%d [style = invis];\n", Prev, Gia_ObjId(p, pNode) );
        Prev = Gia_ObjId(p, pNode);
    }

    // generate edges
    Gia_ManForEachCo( p, pNode, i )
    {
        int iNode = Gia_ObjId( p, pNode );
        fprintf( pFile, "Node%d",  iNode );
        fprintf( pFile, " -> " );
        fprintf( pFile, "Node%d",  Gia_ShowAddOut(vAdds, vMapAdds, Gia_ObjFaninId0(pNode, iNode)) );
        fprintf( pFile, " [" );
        fprintf( pFile, "style = %s", Gia_ObjFaninC0(pNode)? "dotted" : "solid" );
        fprintf( pFile, "]" );
        fprintf( pFile, ";\n" );
    }
    Gia_ManForEachObjVec( vOrder, p, pNode, i )
    {
        int iNode = Gia_ObjId( p, pNode );
        if ( Vec_IntEntry(vMapAdds, Gia_ObjId(p, pNode)) >= 0 )
        {
            int k, iBox = Vec_IntEntry(vMapAdds, iNode);
            for ( k = 0; k < 3; k++ )
                if ( Vec_IntEntry(vAdds, 6*iBox+k) )
                {
                    int iBox2 = Vec_IntEntry(vMapAdds, Vec_IntEntry(vAdds, 6*iBox+k));
                    int fXor2 = iBox2 >= 0 ? (int)(Vec_IntEntry(vAdds, 6*iBox2+3) == Vec_IntEntry(vAdds, 6*iBox+k)) : 0;
                    fprintf( pFile, "Node%d",  Gia_ShowAddOut(vAdds, vMapAdds, iNode) );
                    fprintf( pFile, " -> " );
                    fprintf( pFile, "Node%d",  Gia_ShowAddOut(vAdds, vMapAdds, Vec_IntEntry(vAdds, 6*iBox+k)) );
                    fprintf( pFile, " [" );
                    fprintf( pFile, "style = %s", fXor2? "bold" : "solid" );
                    fprintf( pFile, "]" );
                    fprintf( pFile, ";\n" );
                }
            continue;
        }
        if ( Vec_IntEntry(vMapXors, Gia_ObjId(p, pNode)) >= 0 )
        {
            int k, iXor = Vec_IntEntry(vMapXors, iNode);
            for ( k = 1; k < 4; k++ )
                if ( Vec_IntEntry(vXors, 4*iXor+k) )
                {
                    int iXor2 = Vec_IntEntry(vMapXors, Vec_IntEntry(vXors, 4*iXor+k));
                    fprintf( pFile, "Node%d",  iNode );
                    fprintf( pFile, " -> " );
                    fprintf( pFile, "Node%d",  Gia_ShowAddOut(vAdds, vMapAdds, Vec_IntEntry(vXors, 4*iXor+k)) );
                    fprintf( pFile, " [" );
                    fprintf( pFile, "style = %s", iXor2 >= 0? "bold" : "solid" );
                    fprintf( pFile, "]" );
                    fprintf( pFile, ";\n" );
                }
            continue;
        }
        // generate the edge from this node to the next
        fprintf( pFile, "Node%d",  iNode );
        fprintf( pFile, " -> " );
        fprintf( pFile, "Node%d",  Gia_ShowAddOut(vAdds, vMapAdds, Gia_ObjFaninId0(pNode, iNode)) );
        fprintf( pFile, " [" );
        fprintf( pFile, "style = %s", Gia_ObjFaninC0(pNode)? "dotted" : "solid" );
        fprintf( pFile, "]" );
        fprintf( pFile, ";\n" );
        if ( !Gia_ObjIsAnd(pNode) )
            continue;
        // generate the edge from this node to the next
        fprintf( pFile, "Node%d",  iNode );
        fprintf( pFile, " -> " );
        fprintf( pFile, "Node%d",  Gia_ShowAddOut(vAdds, vMapAdds, Gia_ObjFaninId1(pNode, iNode)) );
        fprintf( pFile, " [" );
        fprintf( pFile, "style = %s", Gia_ObjFaninC1(pNode)? "dotted" : "solid" );
        fprintf( pFile, "]" );
        fprintf( pFile, ";\n" );

        if ( !Gia_ObjIsMux(p, pNode) )
            continue;
        // generate the edge from this node to the next
        fprintf( pFile, "Node%d",  iNode );
        fprintf( pFile, " -> " );
        fprintf( pFile, "Node%d",  Gia_ShowAddOut(vAdds, vMapAdds, Gia_ObjFaninId2(p, iNode)) );
        fprintf( pFile, " [" );
        fprintf( pFile, "style = %s", Gia_ObjFaninC2(p, pNode)? "dotted" : "solid" );
        fprintf( pFile, "]" );
        fprintf( pFile, ";\n" );
    }

    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );
    fclose( pFile );

    // unmark nodes
    if ( vBold )
        Gia_ManForEachObjVec( vBold, p, pNode, i )
            pNode->fMark0 = 0;

    Vec_IntFreeP( &p->vLevels );
}